

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::PReLU_x86_fma::forward_inplace(PReLU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  void *pvVar3;
  float *pfVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [32];
  int iVar16;
  undefined1 auVar17 [16];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar18 [32];
  
  iVar11 = bottom_top_blob->elempack;
  iVar9 = bottom_top_blob->dims;
  iVar8 = bottom_top_blob->w;
  uVar2 = bottom_top_blob->h;
  if (iVar9 == 3) {
    iVar9 = iVar8 * iVar11 * uVar2;
    uVar12 = 0;
    uVar2 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar2 = 0;
    }
    for (; uVar12 != uVar2; uVar12 = uVar12 + 1) {
      pfVar4 = (float *)(this->super_PReLU).slope_data.data;
      if ((this->super_PReLU).num_slope < 2) {
        fVar19 = *pfVar4;
        auVar21._4_4_ = fVar19;
        auVar21._0_4_ = fVar19;
        auVar21._8_4_ = fVar19;
        auVar21._12_4_ = fVar19;
LAB_002f6b71:
        auVar23._16_16_ = auVar21;
        auVar23._0_16_ = auVar21;
      }
      else {
        fVar19 = pfVar4[uVar12];
        if (iVar11 == 4) {
          auVar21 = *(undefined1 (*) [16])(pfVar4 + uVar12 * 4);
          goto LAB_002f6b71;
        }
        auVar21 = vshufps_avx(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19),0);
        if (iVar11 != 8) goto LAB_002f6b71;
        auVar23 = *(undefined1 (*) [32])(pfVar4 + uVar12 * 8);
      }
      pvVar3 = bottom_top_blob->data;
      sVar5 = bottom_top_blob->elemsize;
      sVar6 = bottom_top_blob->cstep;
      pauVar15 = (undefined1 (*) [32])(sVar6 * uVar12 * sVar5 + (long)pvVar3);
      lVar10 = 0;
      for (iVar8 = 0; iVar8 + 7 < iVar9; iVar8 = iVar8 + 8) {
        auVar22 = vmaxps_avx(*pauVar15,ZEXT1232(ZEXT812(0)));
        auVar18 = vminps_avx(*pauVar15,ZEXT1232(ZEXT812(0)));
        auVar20 = vfmadd213ps_fma(auVar18,auVar23,auVar22);
        *pauVar15 = ZEXT1632(auVar20);
        pauVar15 = pauVar15 + 1;
        lVar10 = lVar10 + 8;
      }
      for (; iVar8 + 3 < iVar9; iVar8 = iVar8 + 4) {
        auVar20 = vmaxps_avx(*(undefined1 (*) [16])*pauVar15,ZEXT816(0));
        auVar17 = vminps_avx(*(undefined1 (*) [16])*pauVar15,ZEXT816(0));
        auVar20 = vfmadd213ps_fma(auVar17,auVar21,auVar20);
        *(undefined1 (*) [16])*pauVar15 = auVar20;
        pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
        lVar10 = lVar10 + 4;
      }
      lVar13 = sVar6 * sVar5 * uVar12;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar1 = *(float *)((long)pvVar3 + lVar10 * 4 + lVar13);
        if (fVar1 < 0.0) {
          *(float *)((long)pvVar3 + lVar10 * 4 + lVar13) = fVar1 * fVar19;
        }
      }
    }
  }
  else if (iVar9 == 2) {
    iVar8 = iVar8 * iVar11;
    uVar14 = 0;
    uVar12 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar12 = uVar14;
    }
    for (; uVar14 != uVar12; uVar14 = uVar14 + 1) {
      pfVar4 = (float *)(this->super_PReLU).slope_data.data;
      if ((this->super_PReLU).num_slope < 2) {
        fVar19 = *pfVar4;
        auVar20._4_4_ = fVar19;
        auVar20._0_4_ = fVar19;
        auVar20._8_4_ = fVar19;
        auVar20._12_4_ = fVar19;
LAB_002f6a42:
        auVar22._16_16_ = auVar20;
        auVar22._0_16_ = auVar20;
      }
      else {
        fVar19 = pfVar4[uVar14];
        if (iVar11 == 4) {
          auVar20 = *(undefined1 (*) [16])(pfVar4 + uVar14 * 4);
          goto LAB_002f6a42;
        }
        auVar20 = vshufps_avx(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19),0);
        if (iVar11 != 8) goto LAB_002f6a42;
        auVar22 = *(undefined1 (*) [32])(pfVar4 + uVar14 * 8);
      }
      pvVar3 = bottom_top_blob->data;
      sVar5 = bottom_top_blob->elemsize;
      iVar9 = bottom_top_blob->w;
      pauVar15 = (undefined1 (*) [32])(uVar14 * (long)iVar9 * sVar5 + (long)pvVar3);
      lVar10 = 0;
      for (iVar16 = 0; iVar16 + 7 < iVar8; iVar16 = iVar16 + 8) {
        auVar23 = vmaxps_avx(*pauVar15,ZEXT832(0));
        auVar18 = vminps_avx(*pauVar15,ZEXT832(0));
        auVar21 = vfmadd213ps_fma(auVar18,auVar22,auVar23);
        *pauVar15 = ZEXT1632(auVar21);
        pauVar15 = pauVar15 + 1;
        lVar10 = lVar10 + 8;
      }
      for (; iVar16 + 3 < iVar8; iVar16 = iVar16 + 4) {
        auVar21 = vmaxps_avx(*(undefined1 (*) [16])*pauVar15,ZEXT816(0));
        auVar17 = vminps_avx(*(undefined1 (*) [16])*pauVar15,ZEXT816(0));
        auVar21 = vfmadd213ps_fma(auVar17,auVar20,auVar21);
        *(undefined1 (*) [16])*pauVar15 = auVar21;
        pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
        lVar10 = lVar10 + 4;
      }
      lVar13 = sVar5 * uVar14 * (long)iVar9;
      for (; (int)lVar10 < iVar8; lVar10 = lVar10 + 1) {
        fVar1 = *(float *)((long)pvVar3 + lVar10 * 4 + lVar13);
        if (fVar1 < 0.0) {
          *(float *)((long)pvVar3 + lVar10 * 4 + lVar13) = fVar1 * fVar19;
        }
      }
    }
  }
  else if (iVar9 == 1) {
    iVar11 = iVar11 * iVar8;
    pvVar3 = bottom_top_blob->data;
    pfVar4 = (float *)(this->super_PReLU).slope_data.data;
    if ((this->super_PReLU).num_slope < 2) {
      fVar19 = *pfVar4;
      auVar17._4_4_ = fVar19;
      auVar17._0_4_ = fVar19;
      auVar17._8_4_ = fVar19;
      auVar17._12_4_ = fVar19;
      auVar18._16_4_ = fVar19;
      auVar18._0_16_ = auVar17;
      auVar18._20_4_ = fVar19;
      auVar18._24_4_ = fVar19;
      auVar18._28_4_ = fVar19;
      iVar9 = (int)((long)iVar11 / 8);
      lVar10 = 0;
      uVar12 = 0;
      if (0 < iVar9) {
        uVar12 = (long)iVar11 / 8 & 0xffffffff;
      }
      for (; uVar12 * 0x20 != lVar10; lVar10 = lVar10 + 0x20) {
        auVar23 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar3 + lVar10),ZEXT832(0));
        auVar22 = vminps_avx(*(undefined1 (*) [32])((long)pvVar3 + lVar10),ZEXT832(0));
        auVar21 = vfmadd213ps_fma(auVar22,auVar18,auVar23);
        *(undefined1 (*) [32])((long)pvVar3 + lVar10) = ZEXT1632(auVar21);
      }
      iVar8 = iVar9 * 8;
      uVar12 = (long)(iVar11 + iVar9 * -8) / 4;
      iVar9 = (int)uVar12;
      auVar21 = vshufps_avx(auVar17,auVar17,0);
      lVar10 = 0;
      uVar14 = 0;
      if (0 < iVar9) {
        uVar14 = uVar12 & 0xffffffff;
      }
      for (; uVar14 * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
        auVar20 = *(undefined1 (*) [16])((long)pvVar3 + lVar10 + (long)iVar8 * 4);
        auVar17 = vmaxps_avx(auVar20,ZEXT816(0) << 0x40);
        auVar20 = vminps_avx(auVar20,ZEXT816(0) << 0x40);
        auVar20 = vfmadd213ps_fma(auVar20,auVar21,auVar17);
        *(undefined1 (*) [16])((long)pvVar3 + lVar10 + (long)iVar8 * 4) = auVar20;
      }
      for (lVar10 = (long)(iVar8 + iVar9 * 4); lVar10 < iVar11; lVar10 = lVar10 + 1) {
        fVar1 = *(float *)((long)pvVar3 + lVar10 * 4);
        if (fVar1 < 0.0) {
          *(float *)((long)pvVar3 + lVar10 * 4) = fVar1 * fVar19;
        }
      }
    }
    else {
      iVar9 = (int)((long)iVar11 / 8);
      lVar10 = 0;
      uVar12 = 0;
      if (0 < iVar9) {
        uVar12 = (long)iVar11 / 8 & 0xffffffff;
      }
      for (; uVar12 * 0x20 != lVar10; lVar10 = lVar10 + 0x20) {
        auVar23 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar3 + lVar10),ZEXT1232(ZEXT812(0)));
        auVar22 = vminps_avx(*(undefined1 (*) [32])((long)pvVar3 + lVar10),ZEXT1232(ZEXT812(0)));
        auVar21 = vfmadd132ps_fma(auVar22,auVar23,*(undefined1 (*) [32])((long)pfVar4 + lVar10));
        *(undefined1 (*) [32])((long)pvVar3 + lVar10) = ZEXT1632(auVar21);
      }
      uVar12 = (long)(iVar11 + iVar9 * -8) / 4;
      iVar8 = (int)uVar12;
      lVar13 = (long)(iVar9 * 8);
      lVar10 = 0;
      uVar14 = 0;
      if (0 < iVar8) {
        uVar14 = uVar12 & 0xffffffff;
      }
      for (; uVar14 * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
        auVar21 = *(undefined1 (*) [16])((long)pvVar3 + lVar10 + lVar13 * 4);
        auVar20 = vmaxps_avx(auVar21,ZEXT416(0) << 0x20);
        auVar21 = vminps_avx(auVar21,ZEXT416(0) << 0x20);
        auVar21 = vfmadd132ps_fma(auVar21,auVar20,
                                  *(undefined1 (*) [16])((long)pfVar4 + lVar10 + lVar13 * 4));
        *(undefined1 (*) [16])((long)pvVar3 + lVar10 + lVar13 * 4) = auVar21;
      }
      pvVar7 = (this->super_PReLU).slope_data.data;
      for (lVar10 = (long)(iVar9 * 8 + iVar8 * 4); lVar10 < iVar11; lVar10 = lVar10 + 1) {
        fVar19 = *(float *)((long)pvVar3 + lVar10 * 4);
        if (fVar19 < 0.0) {
          *(float *)((long)pvVar3 + lVar10 * 4) = fVar19 * *(float *)((long)pvVar7 + lVar10 * 4);
        }
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_loadu_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}